

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_statemach_act(connectdata *conn)

{
  _Bool local_49;
  size_t local_40;
  size_t nread;
  pingpong *pp;
  pop3_conn *pop3c;
  curl_socket_t local_20;
  int pop3code;
  curl_socket_t sock;
  CURLcode result;
  connectdata *conn_local;
  
  pop3code = 0;
  local_20 = conn->sock[0];
  nread = (size_t)&conn->proto;
  local_40 = 0;
  pp = (pingpong *)nread;
  _sock = conn;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    conn_local._4_4_ = pop3_perform_upgrade_tls(conn);
  }
  else if ((conn->proto).ftpc.pp.sendleft == 0) {
    do {
      pop3code = Curl_pp_readresp(local_20,(pingpong *)nread,(int *)((long)&pop3c + 4),&local_40);
      if (pop3code != CURLE_OK) {
        return pop3code;
      }
      if (pop3c._4_4_ == 0) break;
      switch(*(undefined4 *)&pp[1].cache) {
      case 1:
        pop3code = pop3_state_servergreet_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 2:
        pop3code = pop3_state_capa_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 3:
        pop3code = pop3_state_starttls_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 5:
        pop3code = pop3_state_auth_plain_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 6:
        pop3code = pop3_state_auth_login_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 7:
        pop3code = pop3_state_auth_login_password_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache)
        ;
        break;
      case 8:
        pop3code = pop3_state_auth_cram_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 9:
        pop3code = pop3_state_auth_digest_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 10:
        pop3code = pop3_state_auth_digest_resp_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x10:
        pop3code = pop3_state_auth_xoauth2_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x11:
        pop3code = pop3_state_auth_cancel_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x12:
        pop3code = pop3_state_auth_final_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x13:
        pop3code = pop3_state_apop_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x14:
        pop3code = pop3_state_user_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x15:
        pop3code = pop3_state_pass_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x16:
        pop3code = pop3_state_command_resp(_sock,pop3c._4_4_,*(pop3state *)&pp[1].cache);
        break;
      case 0x17:
      default:
        state(_sock,POP3_STOP);
      }
      local_49 = false;
      if ((pop3code == 0) && (local_49 = false, *(int *)&pp[1].cache != 0)) {
        local_49 = Curl_pp_moredata((pingpong *)nread);
      }
    } while (local_49 != false);
    conn_local._4_4_ = pop3code;
  }
  else {
    conn_local._4_4_ = Curl_pp_flushsend((pingpong *)nread);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_PLAIN:
      result = pop3_state_auth_plain_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN:
      result = pop3_state_auth_login_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_LOGIN_PASSWD:
      result = pop3_state_auth_login_password_resp(conn, pop3code,
                                                   pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_AUTH_CRAMMD5:
      result = pop3_state_auth_cram_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5:
      result = pop3_state_auth_digest_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_DIGESTMD5_RESP:
      result = pop3_state_auth_digest_resp_resp(conn, pop3code, pop3c->state);
      break;
#endif

#ifdef USE_NTLM
    case POP3_AUTH_NTLM:
      result = pop3_state_auth_ntlm_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_NTLM_TYPE2MSG:
      result = pop3_state_auth_ntlm_type2msg_resp(conn, pop3code,
                                                  pop3c->state);
      break;
#endif

#if defined(USE_WINDOWS_SSPI)
    case POP3_AUTH_GSSAPI:
      result = pop3_state_auth_gssapi_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_TOKEN:
      result = pop3_state_auth_gssapi_token_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_GSSAPI_NO_DATA:
      result = pop3_state_auth_gssapi_no_data_resp(conn, pop3code,
                                                   pop3c->state);
      break;
#endif

    case POP3_AUTH_XOAUTH2:
      result = pop3_state_auth_xoauth2_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_CANCEL:
      result = pop3_state_auth_cancel_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH_FINAL:
      result = pop3_state_auth_final_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}